

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_uint_32 png_get_pixels_per_inch(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  png_uint_32 pVar1;
  png_fixed_point result;
  undefined8 uStack_8;
  
  if ((((info_ptr == (png_const_inforp)0x0 || png_ptr == (png_const_structrp)0x0) ||
       ((info_ptr->valid & 0x80) == 0)) || (info_ptr->phys_unit_type != '\x01')) ||
     (uStack_8 = (ulong)info_ptr->x_pixels_per_unit,
     info_ptr->x_pixels_per_unit != info_ptr->y_pixels_per_unit)) {
    uStack_8 = 0;
  }
  if (-1 < (int)uStack_8) {
    pVar1 = png_muldiv((png_fixed_point_p)((long)&uStack_8 + 4),(int)uStack_8,0x7f,5000);
    if (pVar1 != 0) {
      pVar1 = uStack_8._4_4_;
    }
    return pVar1;
  }
  return 0;
}

Assistant:

png_uint_32 PNGAPI
png_get_pixels_per_meter(png_const_structrp png_ptr, png_const_inforp info_ptr)
{
#ifdef PNG_pHYs_SUPPORTED
   png_debug(1, "in png_get_pixels_per_meter");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_pHYs) != 0)
   {
      if (info_ptr->phys_unit_type == PNG_RESOLUTION_METER &&
          info_ptr->x_pixels_per_unit == info_ptr->y_pixels_per_unit)
         return info_ptr->x_pixels_per_unit;
   }
#else
   PNG_UNUSED(png_ptr)
   PNG_UNUSED(info_ptr)
#endif

   return 0;
}